

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

void __thiscall i2p::sam::Session::~Session(Session *this)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  unique_lock<std::mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_20,&this->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
             ,0x8a,false);
  Disconnect(this);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  std::__cxx11::string::~string((string *)&this->m_session_id);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&this->m_my_addr);
  std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr(&this->m_control_sock);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_private_key).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  Proxy::~Proxy(&this->m_control_host);
  std::filesystem::__cxx11::path::~path((path *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Session::~Session()
{
    LOCK(m_mutex);
    Disconnect();
}